

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O2

void cuddCacheFlush(DdManager *table)

{
  DdCache *pDVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  pDVar1 = table->cache;
  uVar2 = 0;
  uVar3 = (ulong)table->cacheSlots;
  if ((int)table->cacheSlots < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0x28 - uVar2 != 0; uVar2 = uVar2 + 0x28) {
    dVar4 = 1.0;
    if (*(long *)((long)&pDVar1->data + uVar2) == 0) {
      dVar4 = 0.0;
    }
    table->cachedeletions = dVar4 + table->cachedeletions;
    *(undefined8 *)((long)&pDVar1->data + uVar2) = 0;
  }
  table->cacheLastInserts = table->cacheinserts;
  return;
}

Assistant:

void
cuddCacheFlush(
  DdManager * table)
{
    int i, slots;
    DdCache *cache;

    slots = table->cacheSlots;
    cache = table->cache;
    for (i = 0; i < slots; i++) {
        table->cachedeletions += cache[i].data != NULL;
        cache[i].data = NULL;
    }
    table->cacheLastInserts = table->cacheinserts;

    return;

}